

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O1

void ctemplate::CreateOrCleanTestDir(string *dirname)

{
  char *__haystack;
  DIR *__dirp;
  dirent *pdVar1;
  char *pcVar2;
  size_t sVar3;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  __dirp = opendir((dirname->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    mkdir((dirname->_M_dataplus)._M_p,0x1ed);
    return;
  }
  do {
    pdVar1 = readdir(__dirp);
    if (pdVar1 == (dirent *)0x0) break;
    __haystack = pdVar1->d_name;
    pcVar2 = strstr(__haystack,"template");
    if (pcVar2 != (char *)0x0) {
      local_70[0] = local_60;
      sVar3 = strlen(__haystack);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,__haystack,__haystack + sVar3);
      ctemplate::PathJoin((string *)local_50,(string *)dirname);
      unlink(local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
  } while (pdVar1 != (dirent *)0x0);
  closedir(__dirp);
  return;
}

Assistant:

void CreateOrCleanTestDir(const string& dirname) {
  DIR* dir = opendir(dirname.c_str());
  if (!dir) {   // directory doesn't exist or something like that
    mkdir(dirname.c_str(), 0755);   // make the dir if we can
    return;
  }
  while (struct dirent* d = readdir(dir)) {
    if (strstr(d->d_name, "template"))
      unlink(PathJoin(dirname, d->d_name).c_str());
  }
  closedir(dir);
}